

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O3

void __thiscall
PackageMempoolAcceptResult::PackageMempoolAcceptResult
          (PackageMempoolAcceptResult *this,uint256 *wtxid,MempoolAcceptResult *result)

{
  long in_FS_OFFSET;
  initializer_list<std::pair<const_uint256,_MempoolAcceptResult>_> __l;
  allocator_type local_11a;
  less<uint256> local_119;
  pair<const_uint256,_MempoolAcceptResult> local_118;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_state).super_ValidationState<PackageValidationResult>.m_mode = M_VALID;
  (this->m_state).super_ValidationState<PackageValidationResult>.m_result = PCKG_RESULT_UNSET;
  (this->m_state).super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&(this->m_state).super_ValidationState<PackageValidationResult>.m_reject_reason.
                 field_2;
  (this->m_state).super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       0;
  (this->m_state).super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_local_buf[0] = '\0';
  (this->m_state).super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&(this->m_state).super_ValidationState<PackageValidationResult>.m_debug_message.
                 field_2;
  (this->m_state).super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
       0;
  (this->m_state).super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
  _M_local_buf[0] = '\0';
  local_118.first.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(wtxid->super_base_blob<256U>).m_data._M_elems;
  local_118.first.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((wtxid->super_base_blob<256U>).m_data._M_elems + 8);
  local_118.first.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((wtxid->super_base_blob<256U>).m_data._M_elems + 0x10);
  local_118.first.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((wtxid->super_base_blob<256U>).m_data._M_elems + 0x18);
  MempoolAcceptResult::MempoolAcceptResult(&local_118.second,result);
  __l._M_len = 1;
  __l._M_array = &local_118;
  std::
  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  ::map(&this->m_tx_results,__l,&local_119,&local_11a);
  if (local_118.second.m_wtxids_fee_calculations.
      super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
      ._M_engaged == true) {
    local_118.second.m_wtxids_fee_calculations.
    super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
    ._M_engaged = false;
    if (local_118.second.m_wtxids_fee_calculations.
        super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
        ._M_payload._M_value.
        super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118.second.m_wtxids_fee_calculations.
                      super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                      ._M_payload._M_value.
                      super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_118.second.m_wtxids_fee_calculations.
                            super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                            ._M_payload._M_value.
                            super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      local_118.second.m_wtxids_fee_calculations.
                      super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                      ._M_payload._0_8_);
    }
  }
  std::__cxx11::
  _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::_M_clear(&local_118.second.m_replaced_transactions.
              super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.second.m_state.super_ValidationState<TxValidationResult>.m_debug_message.
         _M_dataplus._M_p !=
      &local_118.second.m_state.super_ValidationState<TxValidationResult>.m_debug_message.field_2) {
    operator_delete(local_118.second.m_state.super_ValidationState<TxValidationResult>.
                    m_debug_message._M_dataplus._M_p,
                    local_118.second.m_state.super_ValidationState<TxValidationResult>.
                    m_debug_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.second.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
         _M_dataplus._M_p !=
      &local_118.second.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2) {
    operator_delete(local_118.second.m_state.super_ValidationState<TxValidationResult>.
                    m_reject_reason._M_dataplus._M_p,
                    local_118.second.m_state.super_ValidationState<TxValidationResult>.
                    m_reject_reason.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit PackageMempoolAcceptResult(const uint256& wtxid, const MempoolAcceptResult& result)
        : m_tx_results{ {wtxid, result} } {}